

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O1

void get_max_peaks(filename_list_node *fln,file_data *result)

{
  double dVar1;
  void *pvVar2;
  
  pvVar2 = fln->d;
  if (*(int *)((long)pvVar2 + 0x50) != 0) {
    dVar1 = *(double *)((long)pvVar2 + 0x28);
    if (result->peak <= dVar1 && dVar1 != result->peak) {
      result->peak = dVar1;
    }
    dVar1 = *(double *)((long)pvVar2 + 0x30);
    if (result->true_peak <= dVar1 && dVar1 != result->true_peak) {
      result->true_peak = dVar1;
    }
  }
  return;
}

Assistant:

void
get_max_peaks(struct filename_list_node *fln, struct file_data *result)
{
	struct file_data *fd = (struct file_data *)fln->d;

	if (fd->scanned) {
		if (fd->peak > result->peak) {
			result->peak = fd->peak;
		}
		if (fd->true_peak > result->true_peak) {
			result->true_peak = fd->true_peak;
		}
	}
}